

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

size_t encoder_nop_read(char *buffer,size_t size,_Bool ateof,curl_mimepart *part)

{
  size_t *psVar1;
  ulong __n;
  
  __n = (part->encstate).bufend - (part->encstate).bufbeg;
  if (size <= __n) {
    __n = size;
  }
  if (__n != 0) {
    memcpy(buffer,(part->encstate).buf,__n);
  }
  psVar1 = &(part->encstate).bufbeg;
  *psVar1 = *psVar1 + __n;
  return __n;
}

Assistant:

static size_t encoder_nop_read(char *buffer, size_t size, bool ateof,
                               curl_mimepart *part)
{
  mime_encoder_state *st = &part->encstate;
  size_t insize = st->bufend - st->bufbeg;

  (void) ateof;

  if(size > insize)
    size = insize;
  if(size)
    memcpy(buffer, st->buf, size);
  st->bufbeg += size;
  return size;
}